

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState *obj,int idx)

{
  uint uVar1;
  ImGuiInputTextFlags IVar2;
  unsigned_short *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = obj->CurLenW;
  uVar5 = idx + 1;
  uVar6 = uVar5;
  if ((int)uVar5 < (int)uVar1) {
    IVar2 = obj->Flags;
    do {
      if (-1 < (short)IVar2) {
        uVar6 = uVar5;
        if ((int)(uVar5 - 1) < 0) break;
        puVar3 = (obj->TextW).Data;
        bVar4 = is_separator((uint)puVar3[(ulong)uVar5 - 1]);
        if ((!bVar4) && (bVar4 = is_separator((uint)puVar3[uVar5]), bVar4)) break;
      }
      uVar5 = uVar5 + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  if ((int)uVar6 < (int)uVar1) {
    uVar1 = uVar6;
  }
  return uVar1;
}

Assistant:

static int  STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState* obj, int idx)   { idx++; int len = obj->CurLenW; while (idx < len && !is_word_boundary_from_left(obj, idx)) idx++; return idx > len ? len : idx; }